

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_function.h
# Opt level: O2

value * __thiscall
mjs::gc_function::
impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/date_object.cpp:489:63)>
::call(value *__return_storage_ptr__,
      impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_date_object_cpp:489:63)>
      *this,value *this_,vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  gc_heap *h;
  void *pvVar1;
  basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *pbVar2;
  wostream *pwVar3;
  native_error_exception *this_00;
  global_object *this_01;
  gc_heap_ptr<mjs::global_object> *this_02;
  _Put_time<wchar_t> __f;
  gc_heap_ptr_untyped local_220;
  gc_heap_ptr<mjs::date_object> o;
  wstring_view local_200 [2];
  wstring_view local_1e0;
  tm tm;
  wostringstream woss;
  
  make_date_object::anon_class_32_2_842af841::operator()
            ((anon_class_32_2_842af841 *)&o,(value *)&this->f);
  pvVar1 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&o);
  this_02 = &(this->f).global;
  if ((ulong)ABS(*(double *)((long)pvVar1 + 0x20)) < 0x7ff0000000000000) {
    anon_unknown_37::date_helper::tm_from_time(&tm,*(double *)((long)pvVar1 + 0x20));
    std::__cxx11::wostringstream::wostringstream((wostringstream *)&woss);
    __f._M_fmt = L"%Y-%m-%dT%H:%M:%S";
    __f._M_tmb = &tm;
    pbVar2 = std::operator<<((basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *)&woss,__f);
    pwVar3 = std::operator<<(pbVar2,'.');
    *(undefined8 *)(pwVar3 + *(long *)(*(long *)pwVar3 + -0x18) + 0x10) = 3;
    pwVar3 = std::operator<<(pwVar3,0x30);
    pwVar3 = std::wostream::_M_insert<long>((long)pwVar3);
    std::operator<<(pwVar3,'Z');
    h = (this_02->super_gc_heap_ptr_untyped).heap_;
    std::__cxx11::wstringbuf::str();
    local_1e0._M_len = (size_t)local_200[0]._M_str;
    local_1e0._M_str = (wchar_t *)local_200[0]._M_len;
    string::string((string *)&local_220,h,&local_1e0);
    std::__cxx11::wstring::~wstring((wstring *)local_200);
    std::__cxx11::wostringstream::~wostringstream((wostringstream *)&woss);
    value::value(__return_storage_ptr__,(string *)&local_220);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_220);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&o.super_gc_heap_ptr_untyped);
    return __return_storage_ptr__;
  }
  this_00 = (native_error_exception *)__cxa_allocate_exception(0x58);
  this_01 = (global_object *)gc_heap_ptr_untyped::get(&this_02->super_gc_heap_ptr_untyped);
  global_object::stack_trace_abi_cxx11_((wstring *)&woss,this_01);
  tm._8_8_ = _woss;
  local_200[0]._M_len = 0xc;
  local_200[0]._M_str = L"Invalid Date";
  native_error_exception::native_error_exception(this_00,range,(wstring_view *)&tm,local_200);
  __cxa_throw(this_00,&native_error_exception::typeinfo,
              native_error_exception::~native_error_exception);
}

Assistant:

value call(const value& this_, const std::vector<value>& args) override { return f(this_, args); }